

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperatorOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte fun_00;
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  byte in_CL;
  Vector *in_RDX;
  undefined8 in_RDI;
  Vector *unaff_retaddr;
  unsigned_long *result_data;
  unsigned_long *rdata;
  unsigned_long *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  unsigned_long left_00;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  fun_00 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             (VectorType)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x128eca4);
  puVar3 = ConstantVector::GetData<unsigned_long>((Vector *)0x128ecb3);
  puVar4 = ConstantVector::GetData<unsigned_long>((Vector *)0x128ecc2);
  bVar1 = ConstantVector::IsNull((Vector *)0x128ecd1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x128ecdf), !bVar1)) {
    uVar5 = *puVar2;
    left_00 = *puVar3;
    ConstantVector::Validity(in_RDX);
    uVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::AddOperatorOverflowCheck,unsigned_long,unsigned_long,unsigned_long>
                      ((bool)fun_00,left_00,uVar5,in_stack_ffffffffffffffa8,0x128ed42);
    *puVar4 = uVar5;
    return;
  }
  ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}